

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.cpp
# Opt level: O0

hmac_hash * __thiscall hmac_hash::sha512(hmac_hash *this,string *input)

{
  uint8_t *message;
  size_t length;
  EVP_PKEY_CTX *ctx_00;
  allocator local_249;
  ulong local_248;
  size_t i;
  char local_238 [8];
  char buf [129];
  SHA512 ctx;
  byte local_58 [8];
  uint8_t digest [64];
  string *input_local;
  
  ctx_00 = (EVP_PKEY_CTX *)(digest + 0x38);
  ctx.m_h[7]._7_1_ = 0;
  digest._56_8_ = input;
  std::fill<unsigned_char*,char>(local_58,(uchar *)ctx_00,(char *)((long)ctx.m_h + 0x3f));
  SHA512::init((SHA512 *)(buf + 0x80),ctx_00);
  message = (uint8_t *)std::__cxx11::string::c_str();
  length = std::__cxx11::string::length();
  SHA512::update((SHA512 *)(buf + 0x80),message,length);
  SHA512::finish((SHA512 *)(buf + 0x80),local_58);
  i._7_1_ = 0;
  std::fill<char*,char>(local_238,buf + 0x79,(char *)((long)&i + 7));
  for (local_248 = 0; local_248 < 0x40; local_248 = local_248 + 1) {
    sprintf(local_238 + local_248 * 2,"%02x",(ulong)local_58[local_248]);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,local_238,0x80,&local_249);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  return this;
}

Assistant:

std::string sha512(const std::string &input) {
        uint8_t digest[hmac_hash::SHA512::DIGEST_SIZE];
        std::fill(digest, digest + hmac_hash::SHA512::DIGEST_SIZE, '\0');
        hmac_hash::SHA512 ctx;
        ctx.init();
        ctx.update((uint8_t*)input.c_str(), input.length());
        ctx.finish(digest);

        char buf[2 * hmac_hash::SHA512::DIGEST_SIZE + 1];
        std::fill(buf, buf + (2 * hmac_hash::SHA512::DIGEST_SIZE + 1), '\0');
        for(size_t i = 0; i < hmac_hash::SHA512::DIGEST_SIZE; ++i){
            sprintf(buf + i * 2, "%02x", digest[i]);
        }
        return std::string(buf, (2 * hmac_hash::SHA512::DIGEST_SIZE));
    }